

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::SparseTexture2CommitmentTestCase::allocateTexture
          (SparseTexture2CommitmentTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint levels)

{
  int levels_00;
  GLenum err;
  ostream *poVar1;
  GLint levels_local;
  GLuint *texture_local;
  GLint format_local;
  GLint target_local;
  Functions *gl_local;
  SparseTexture2CommitmentTestCase *this_local;
  
  poVar1 = std::operator<<((ostream *)&(this->super_SparseTextureCommitmentTestCase).field_0x88,
                           "Allocate [levels: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,levels);
  std::operator<<(poVar1,"] - ");
  (*(this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[7])(this,gl,(ulong)(uint)target,(ulong)(uint)format,texture);
  if (((target == 0x84f5) || (target == 0x9100)) || (target == 0x9102)) {
    (this->super_SparseTextureCommitmentTestCase).mState.levels = 1;
  }
  else {
    (this->super_SparseTextureCommitmentTestCase).mState.levels = levels;
  }
  if ((target == 0x9100) || (target == 0x9102)) {
    (this->super_SparseTextureCommitmentTestCase).mState.samples = 2;
  }
  else {
    (this->super_SparseTextureCommitmentTestCase).mState.samples = 1;
  }
  levels_00 = ::deMax32((this->super_SparseTextureCommitmentTestCase).mState.levels,
                        (this->super_SparseTextureCommitmentTestCase).mState.samples);
  gl4cts::Texture::Storage
            (gl,target,levels_00,format,(this->super_SparseTextureCommitmentTestCase).mState.width,
             (this->super_SparseTextureCommitmentTestCase).mState.height,
             (this->super_SparseTextureCommitmentTestCase).mState.depth);
  err = (*gl->getError)();
  glu::checkError(err,"TexStorage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                  ,0x3d0);
  return true;
}

Assistant:

bool SparseTexture2CommitmentTestCase::allocateTexture(const Functions& gl, GLint target, GLint format, GLuint& texture,
													   GLint levels)
{
	mLog << "Allocate [levels: " << levels << "] - ";

	prepareTexture(gl, target, format, texture);

	// GL_TEXTURE_RECTANGLE, GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_2D_MULTISAMPLE_ARRAY can have only one level
	if (target != GL_TEXTURE_RECTANGLE && target != GL_TEXTURE_2D_MULTISAMPLE &&
		target != GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		mState.levels = levels;
	}
	else
		mState.levels = 1;

	// GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_2D_MULTISAMPLE_ARRAY can use multiple samples
	if (target != GL_TEXTURE_2D_MULTISAMPLE && target != GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		mState.samples = 1;
	}
	else
		mState.samples = 2;

	Texture::Storage(gl, target, deMax32(mState.levels, mState.samples), format, mState.width, mState.height,
					 mState.depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage");

	return true;
}